

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_semaphores.cpp
# Opt level: O0

void semaphores_in_module(uint W)

{
  code *pcVar1;
  __normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
  first;
  __normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
  first_00;
  __normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
  first_01;
  __normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
  first_02;
  bool bVar2;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *this;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  Expression_lhs<const_unsigned_long> EVar3;
  Expression_lhs<const_unsigned_long_&> EVar4;
  ResultBuilder DOCTEST_RB_4;
  Task m;
  Task t;
  size_t i;
  size_t counter;
  size_t N;
  ResultBuilder DOCTEST_RB_3;
  ResultBuilder DOCTEST_RB_2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  Semaphore *sema;
  iterator __end1;
  iterator __begin1;
  vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *__range1;
  vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> semaphores;
  Executor executor;
  Taskflow taskflow2;
  Taskflow taskflow1;
  Result *in_stack_fffffffffffff788;
  Result *pRVar5;
  Taskflow *in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff798;
  int in_stack_fffffffffffff79c;
  Semaphore *in_stack_fffffffffffff7a0;
  size_type in_stack_fffffffffffff7a8;
  Enum at;
  Taskflow *in_stack_fffffffffffff7b0;
  Executor *this_00;
  Executor *in_stack_fffffffffffff7c0;
  Taskflow *in_stack_fffffffffffff7d0;
  __normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
  in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7e0;
  Enum in_stack_fffffffffffff7e4;
  undefined4 in_stack_fffffffffffff810;
  Enum in_stack_fffffffffffff814;
  Expression_lhs<const_unsigned_long_&> *in_stack_fffffffffffff818;
  ExpressionDecomposer local_7ac;
  vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *local_7a8;
  Enum local_7a0;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffff878;
  size_t in_stack_fffffffffffff880;
  Executor *in_stack_fffffffffffff888;
  ulong local_688;
  ExpressionDecomposer local_64c;
  Taskflow *local_648;
  Enum local_640;
  ResultBuilder local_618;
  undefined4 local_59c;
  unsigned_long local_598;
  Enum local_590;
  size_t local_588;
  ExpressionDecomposer local_57c;
  unsigned_long local_578;
  Enum local_570;
  ResultBuilder local_548;
  undefined4 local_4cc;
  unsigned_long local_4c8;
  Enum local_4c0;
  size_t local_4b8;
  ExpressionDecomposer local_4ac;
  unsigned_long local_4a8;
  Enum local_4a0;
  ResultBuilder local_478;
  undefined4 local_3fc;
  Expression_lhs<const_unsigned_long_&> *local_3f8;
  Enum local_3f0;
  size_t local_3e8;
  ExpressionDecomposer local_3dc;
  Expression_lhs<const_unsigned_long_&> *local_3d8;
  Enum local_3d0;
  ResultBuilder local_3a8;
  reference local_330;
  Semaphore *local_328;
  __normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
  local_320;
  Executor *local_318;
  Executor local_308 [2];
  
  tf::Taskflow::Taskflow(in_stack_fffffffffffff7b0);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff7b0);
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffff790,in_stack_fffffffffffff788)
  ;
  tf::Executor::Executor
            (in_stack_fffffffffffff888,in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11688e);
  std::allocator<tf::Semaphore>::allocator((allocator<tf::Semaphore> *)0x1168a3);
  std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::vector
            ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)in_stack_fffffffffffff7b0,
             in_stack_fffffffffffff7a8,(allocator_type *)in_stack_fffffffffffff7a0);
  std::allocator<tf::Semaphore>::~allocator((allocator<tf::Semaphore> *)0x1168cc);
  local_318 = local_308;
  local_320._M_current =
       (Semaphore *)
       std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::begin
                 ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)in_stack_fffffffffffff788
                 );
  local_328 = (Semaphore *)
              std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::end
                        ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)
                         in_stack_fffffffffffff788);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                        *)in_stack_fffffffffffff790,
                       (__normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                        *)in_stack_fffffffffffff788);
    if (!bVar2) {
      for (local_688 = 0; local_688 < 0x400; local_688 = local_688 + 1) {
        tf::FlowBuilder::
        emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_semaphores_cpp:242:32),_nullptr>
                  ((FlowBuilder *)in_stack_fffffffffffff7d8._M_current,
                   (anon_class_8_1_bc7188dc *)in_stack_fffffffffffff7d0);
        in_stack_fffffffffffff7c0 = local_308;
        std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::begin
                  ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)
                   in_stack_fffffffffffff788);
        std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::end
                  ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)
                   in_stack_fffffffffffff788);
        first._M_current._4_4_ = in_stack_fffffffffffff7e4;
        first._M_current._0_4_ = in_stack_fffffffffffff7e0;
        tf::Task::
        acquire<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
                  ((Task *)in_stack_fffffffffffff7d0,first,in_stack_fffffffffffff7d8);
        std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::begin
                  ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)
                   in_stack_fffffffffffff788);
        std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::end
                  ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)
                   in_stack_fffffffffffff788);
        first_00._M_current._4_4_ = in_stack_fffffffffffff7e4;
        first_00._M_current._0_4_ = in_stack_fffffffffffff7e0;
        tf::Task::
        release<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
                  ((Task *)in_stack_fffffffffffff7d0,first_00,in_stack_fffffffffffff7d8);
      }
      tf::FlowBuilder::composed_of<tf::Taskflow>
                ((FlowBuilder *)in_stack_fffffffffffff7d8._M_current,in_stack_fffffffffffff7d0);
      this_00 = local_308;
      std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::begin
                ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)in_stack_fffffffffffff788)
      ;
      std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::end
                ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)in_stack_fffffffffffff788)
      ;
      first_01._M_current._4_4_ = in_stack_fffffffffffff7e4;
      first_01._M_current._0_4_ = in_stack_fffffffffffff7e0;
      tf::Task::
      acquire<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
                ((Task *)in_stack_fffffffffffff7d0,first_01,in_stack_fffffffffffff7d8);
      at = (Enum)((ulong)local_308 >> 0x20);
      std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::begin
                ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)in_stack_fffffffffffff788)
      ;
      std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::end
                ((vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)in_stack_fffffffffffff788)
      ;
      first_02._M_current._4_4_ = in_stack_fffffffffffff7e4;
      first_02._M_current._0_4_ = in_stack_fffffffffffff7e0;
      tf::Task::
      release<__gnu_cxx::__normal_iterator<tf::Semaphore*,std::vector<tf::Semaphore,std::allocator<tf::Semaphore>>>>
                ((Task *)in_stack_fffffffffffff7d0,first_02,in_stack_fffffffffffff7d8);
      tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                        in_stack_fffffffffffff790);
      std::future<void>::get((future<void> *)in_stack_fffffffffffff7a0);
      tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffff790);
      pRVar5 = (Result *)0x16babd;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)this_00,at,(char *)in_stack_fffffffffffff7a0,
                 in_stack_fffffffffffff79c,(char *)in_stack_fffffffffffff790,"",
                 (char *)in_stack_fffffffffffff7c0);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_7ac,DT_REQUIRE);
      EVar4 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long,_nullptr>
                        ((ExpressionDecomposer *)in_stack_fffffffffffff790,(unsigned_long *)pRVar5);
      this = (vector<tf::Semaphore,_std::allocator<tf::Semaphore>_> *)EVar4.lhs;
      local_7a0 = EVar4.m_at;
      local_7a8 = this;
      doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<unsigned_long,_nullptr>
                (in_stack_fffffffffffff818,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
      doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff790,pRVar5);
      doctest::detail::Result::~Result((Result *)0x1174bb);
      doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffff888,__x_03);
      if ((extraout_AL_03 & 1) == 0) {
        doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff790);
        doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1175b1);
        std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>::~vector(this);
        tf::Executor::~Executor(in_stack_fffffffffffff7c0);
        tf::Taskflow::~Taskflow(in_stack_fffffffffffff790);
        tf::Taskflow::~Taskflow(in_stack_fffffffffffff790);
        return;
      }
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    local_330 = __gnu_cxx::
                __normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
                ::operator*(&local_320);
    pRVar5 = (Result *)0x16babd;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff7b0,(Enum)(in_stack_fffffffffffff7a8 >> 0x20),
               (char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
               (char *)in_stack_fffffffffffff790,"",(char *)in_stack_fffffffffffff7c0);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3dc,DT_REQUIRE);
    local_3e8 = tf::Semaphore::value(in_stack_fffffffffffff7a0);
    EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                      ((ExpressionDecomposer *)in_stack_fffffffffffff790,(unsigned_long *)pRVar5);
    in_stack_fffffffffffff818 = (Expression_lhs<const_unsigned_long_&> *)EVar3.lhs;
    in_stack_fffffffffffff814 = EVar3.m_at;
    local_3fc = 0;
    local_3f8 = in_stack_fffffffffffff818;
    local_3f0 = in_stack_fffffffffffff814;
    local_3d8 = in_stack_fffffffffffff818;
    local_3d0 = in_stack_fffffffffffff814;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              ((Expression_lhs<const_unsigned_long> *)in_stack_fffffffffffff818,
               (int *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff790,pRVar5);
    doctest::detail::Result::~Result((Result *)0x116a58);
    doctest::detail::ResultBuilder::log(&local_3a8,__x);
    in_stack_fffffffffffff810 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffff810);
    if ((extraout_AL & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff790);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x116bb2);
    pRVar5 = (Result *)0x16babd;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff7b0,(Enum)(in_stack_fffffffffffff7a8 >> 0x20),
               (char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
               (char *)in_stack_fffffffffffff790,"",(char *)in_stack_fffffffffffff7c0);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4ac,DT_REQUIRE);
    local_4b8 = tf::Semaphore::max_value(local_330);
    EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                      ((ExpressionDecomposer *)in_stack_fffffffffffff790,(unsigned_long *)pRVar5);
    local_4c8 = EVar3.lhs;
    local_4c0 = EVar3.m_at;
    local_4cc = 0;
    local_4a8 = local_4c8;
    local_4a0 = local_4c0;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              ((Expression_lhs<const_unsigned_long> *)in_stack_fffffffffffff818,
               (int *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff790,pRVar5);
    doctest::detail::Result::~Result((Result *)0x116cc9);
    doctest::detail::ResultBuilder::log(&local_478,__x_00);
    if ((extraout_AL_00 & 1) != 0) break;
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff790);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x116dae);
    tf::Semaphore::reset
              (in_stack_fffffffffffff7a0,
               CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
    pRVar5 = (Result *)0x16babd;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff7b0,(Enum)(in_stack_fffffffffffff7a8 >> 0x20),
               (char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
               (char *)in_stack_fffffffffffff790,"",(char *)in_stack_fffffffffffff7c0);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_57c,DT_REQUIRE);
    local_588 = tf::Semaphore::value(in_stack_fffffffffffff7a0);
    EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                      ((ExpressionDecomposer *)in_stack_fffffffffffff790,(unsigned_long *)pRVar5);
    local_598 = EVar3.lhs;
    in_stack_fffffffffffff7e4 = EVar3.m_at;
    local_59c = 2;
    local_590 = in_stack_fffffffffffff7e4;
    local_578 = local_598;
    local_570 = in_stack_fffffffffffff7e4;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              ((Expression_lhs<const_unsigned_long> *)in_stack_fffffffffffff818,
               (int *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffff790,pRVar5);
    doctest::detail::Result::~Result((Result *)0x116ed3);
    doctest::detail::ResultBuilder::log(&local_548,__x_01);
    in_stack_fffffffffffff7e0 = CONCAT13(extraout_AL_01,(int3)in_stack_fffffffffffff7e0);
    if ((extraout_AL_01 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff790);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x116fb8);
    in_stack_fffffffffffff788 = (Result *)0x16babd;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff7b0,(Enum)(in_stack_fffffffffffff7a8 >> 0x20),
               (char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
               (char *)in_stack_fffffffffffff790,"",(char *)in_stack_fffffffffffff7c0);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_64c,DT_REQUIRE);
    in_stack_fffffffffffff7d8._M_current = (Semaphore *)tf::Semaphore::max_value(local_330);
    EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                      ((ExpressionDecomposer *)in_stack_fffffffffffff790,
                       (unsigned_long *)in_stack_fffffffffffff788);
    in_stack_fffffffffffff7d0 = (Taskflow *)EVar3.lhs;
    local_640 = EVar3.m_at;
    local_648 = in_stack_fffffffffffff7d0;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              ((Expression_lhs<const_unsigned_long> *)in_stack_fffffffffffff818,
               (int *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    doctest::detail::Result::~Result((Result *)0x1170c9);
    doctest::detail::ResultBuilder::log(&local_618,__x_02);
    if ((extraout_AL_02 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffff790);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1171a8);
    __gnu_cxx::
    __normal_iterator<tf::Semaphore_*,_std::vector<tf::Semaphore,_std::allocator<tf::Semaphore>_>_>
    ::operator++(&local_320);
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void semaphores_in_module(unsigned W) {
  
  tf::Taskflow taskflow1;
  tf::Taskflow taskflow2;
  tf::Executor executor(W);
  std::vector<tf::Semaphore> semaphores(10);

  for(auto& sema : semaphores) {
    REQUIRE(sema.value() == 0);
    REQUIRE(sema.max_value() == 0);
    sema.reset(2);
    REQUIRE(sema.value() == 2);
    REQUIRE(sema.max_value() == 2);
  }

  size_t N = 1024;
  size_t counter {0};  

  for(size_t i=0; i<N; i=i+1){
    auto t = taskflow1.emplace([&](){ counter++; });
    t.acquire(semaphores.begin(), semaphores.end());
    t.release(semaphores.begin(), semaphores.end());
  }

  auto m = taskflow2.composed_of(taskflow1);

  m.acquire(semaphores.begin(), semaphores.end());
  m.release(semaphores.begin(), semaphores.end()); 

  executor.run(taskflow2).get();
  REQUIRE(counter == N);
}